

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Unicode.hpp
# Opt level: O1

bool cppjieba::DecodeRunesInString(char *s,size_t len,RuneStrArray *runes)

{
  byte *pbVar1;
  byte bVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  uint32_t j;
  uint32_t uVar8;
  uint32_t i;
  ulong uVar9;
  uint32_t uVar10;
  RuneStr x;
  RuneStr local_44;
  
  if ((RuneStrArray *)runes->ptr_ != runes) {
    free((RuneStrArray *)runes->ptr_);
  }
  runes->ptr_ = runes->buffer_;
  runes->size_ = 0;
  runes->capacity_ = 0x10;
  limonp::LocalVector<cppjieba::RuneStr>::reserve(runes,len >> 1);
  uVar8 = 0;
  uVar6 = 0;
  do {
    uVar9 = uVar6;
    uVar6 = len - uVar9;
    if (len <= uVar9) break;
    if (s == (char *)0x0) {
      bVar3 = false;
      uVar10 = 0;
      uVar5 = 0;
    }
    else {
      pbVar1 = (byte *)(s + uVar9);
      bVar2 = *pbVar1;
      uVar10 = 1;
      bVar3 = true;
      uVar4 = (uint)bVar2;
      uVar5 = uVar4;
      if ((char)bVar2 < '\0') {
        if (uVar6 < 2 || 0xdf < bVar2) {
          if (uVar6 < 3 || 0xef < bVar2) {
            bVar3 = false;
            uVar10 = 0;
            uVar5 = 0;
            if (uVar6 < 4 || 0xf7 < bVar2) goto LAB_0010eba7;
            uVar5 = (pbVar1[2] & 0x3f) << 6 | (pbVar1[1] & 0x3f | (uVar4 & 7) << 6) << 0xc;
            uVar10 = 4;
            lVar7 = 3;
          }
          else {
            uVar5 = (pbVar1[1] & 0x3f | (uVar4 & 0xf) << 6) << 6;
            uVar10 = 3;
            lVar7 = 2;
          }
        }
        else {
          uVar5 = (uVar4 & 0x1f) << 6;
          uVar10 = 2;
          lVar7 = 1;
        }
        bVar3 = true;
        uVar5 = pbVar1[lVar7] & 0x3f | uVar5;
      }
    }
LAB_0010eba7:
    if (bVar3) {
      local_44.unicode_length = 1;
      local_44.rune = uVar5;
      local_44.offset = (uint32_t)uVar9;
      local_44.len = uVar10;
      local_44.unicode_offset = uVar8;
      limonp::LocalVector<cppjieba::RuneStr>::push_back(runes,&local_44);
      uVar8 = uVar8 + 1;
      uVar6 = (ulong)((uint32_t)uVar9 + uVar10);
    }
    else {
      if ((RuneStrArray *)runes->ptr_ != runes) {
        free((RuneStrArray *)runes->ptr_);
      }
      runes->ptr_ = runes->buffer_;
      runes->size_ = 0;
      runes->capacity_ = 0x10;
      uVar6 = uVar9;
    }
  } while (bVar3);
  return len <= uVar9;
}

Assistant:

inline bool DecodeRunesInString(const char* s, size_t len, RuneStrArray& runes) {
  runes.clear();
  runes.reserve(len / 2);
  for (uint32_t i = 0, j = 0; i < len;) {
    RuneStrLite rp = DecodeRuneInString(s + i, len - i);
    if (rp.len == 0) {
      runes.clear();
      return false;
    }
    RuneStr x(rp.rune, i, rp.len, j, 1);
    runes.push_back(x);
    i += rp.len;
    ++j;
  }
  return true;
}